

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

lzma_ret lzma_strm_init(lzma_stream *strm)

{
  lzma_internal *plVar1;
  lzma_stream *strm_local;
  
  if (strm == (lzma_stream *)0x0) {
    strm_local._4_4_ = LZMA_PROG_ERROR;
  }
  else {
    if (strm->internal == (lzma_internal *)0x0) {
      plVar1 = (lzma_internal *)lzma_alloc(0x58,strm->allocator);
      strm->internal = plVar1;
      if (strm->internal == (lzma_internal *)0x0) {
        return LZMA_MEM_ERROR;
      }
      memcpy(strm->internal,&LZMA_NEXT_CODER_INIT,0x40);
    }
    strm->internal->supported_actions[0] = false;
    strm->internal->supported_actions[1] = false;
    strm->internal->supported_actions[2] = false;
    strm->internal->supported_actions[3] = false;
    strm->internal->sequence = ISEQ_RUN;
    strm->internal->allow_buf_error = false;
    strm->total_in = 0;
    strm->total_out = 0;
    strm_local._4_4_ = LZMA_OK;
  }
  return strm_local._4_4_;
}

Assistant:

extern lzma_ret
lzma_strm_init(lzma_stream *strm)
{
	if (strm == NULL)
		return LZMA_PROG_ERROR;

	if (strm->internal == NULL) {
		strm->internal = lzma_alloc(sizeof(lzma_internal),
				strm->allocator);
		if (strm->internal == NULL)
			return LZMA_MEM_ERROR;

		strm->internal->next = LZMA_NEXT_CODER_INIT;
	}

	strm->internal->supported_actions[LZMA_RUN] = false;
	strm->internal->supported_actions[LZMA_SYNC_FLUSH] = false;
	strm->internal->supported_actions[LZMA_FULL_FLUSH] = false;
	strm->internal->supported_actions[LZMA_FINISH] = false;
	strm->internal->sequence = ISEQ_RUN;
	strm->internal->allow_buf_error = false;

	strm->total_in = 0;
	strm->total_out = 0;

	return LZMA_OK;
}